

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint *puVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_GRID pRVar4;
  REF_GRID pRVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  REF_CELL pRVar14;
  uint uVar15;
  bool bVar16;
  REF_INT new_cell;
  REF_INT nnode1;
  REF_INT nnode0;
  REF_INT nodes [27];
  REF_INT node_list1 [1000];
  REF_INT node_list0 [1000];
  uint local_2020;
  int local_201c;
  REF_GRID local_2018;
  REF_BOOL *local_2010;
  uint local_2004;
  uint local_2000;
  int local_1ffc;
  uint local_1ff8 [32];
  uint local_1f78 [1000];
  uint local_fd8 [1002];
  
  *allowed = 0;
  local_2010 = allowed;
  if (node1 < 0) {
LAB_0019d8a1:
    *local_2010 = 1;
    return 0;
  }
  pRVar14 = ref_grid->cell[8];
  pRVar2 = pRVar14->ref_adj;
  if ((node1 < pRVar2->nnode) &&
     (lVar13 = (long)pRVar2->first[(uint)node1], local_2018 = ref_grid, lVar13 != -1)) {
    uVar6 = ref_cell_nodes(pRVar14,pRVar2->item[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
    if (uVar6 == 0) {
      local_2004 = node1;
      do {
        uVar7 = (ulong)pRVar14->node_per;
        if ((long)uVar7 < 1) {
LAB_0019d325:
          uVar6 = ref_cell_with(pRVar14,(REF_INT *)(local_1ff8 + 4),&local_201c);
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x1d4,"ref_collapse_edge_manifold",(ulong)uVar6);
            local_2020 = uVar6;
          }
          if ((uVar6 != 5) && (uVar6 != 0)) {
            return local_2020;
          }
          node1 = local_2004;
          if (local_201c != -1) goto LAB_0019d8c2;
        }
        else {
          uVar8 = 0;
          bVar16 = false;
          do {
            if (local_1ff8[uVar8 + 4] == node0) {
              bVar16 = true;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          if (!bVar16) {
            if (0 < pRVar14->node_per) {
              uVar8 = 0;
              do {
                if (local_1ff8[uVar8 + 4] == node1) {
                  local_1ff8[uVar8 + 4] = node0;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < uVar7);
            }
            goto LAB_0019d325;
          }
        }
        pRVar3 = pRVar14->ref_adj->item;
        lVar13 = (long)pRVar3[(int)lVar13].next;
        if (lVar13 == -1) {
          ref_grid = local_2018;
          if (-1 < node1) goto LAB_0019d205;
          goto LAB_0019d8a1;
        }
        uVar6 = ref_cell_nodes(pRVar14,pRVar3[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
      } while (uVar6 == 0);
    }
    uVar7 = (ulong)uVar6;
    pcVar12 = "nodes";
    uVar11 = 0x1c9;
  }
  else {
LAB_0019d205:
    pRVar14 = ref_grid->cell[3];
    pRVar2 = pRVar14->ref_adj;
    if ((node1 < pRVar2->nnode) && (lVar13 = (long)pRVar2->first[(uint)node1], lVar13 != -1)) {
      uVar6 = ref_cell_nodes(pRVar14,pRVar2->item[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
      pRVar5 = ref_grid;
      pRVar4 = local_2018;
      while (local_2018 = pRVar5, uVar6 == 0) {
        uVar7 = (ulong)pRVar14->node_per;
        if ((long)uVar7 < 1) {
LAB_0019d41d:
          uVar6 = ref_cell_with(pRVar14,(REF_INT *)(local_1ff8 + 4),&local_201c);
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x1e9,"ref_collapse_edge_manifold",(ulong)uVar6);
            local_2020 = uVar6;
          }
          if ((uVar6 != 5) && (uVar6 != 0)) {
            return local_2020;
          }
          if (local_201c != -1) goto LAB_0019d8c2;
        }
        else {
          uVar8 = 0;
          bVar16 = false;
          do {
            if (local_1ff8[uVar8 + 4] == node0) {
              bVar16 = true;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          if (!bVar16) {
            if (0 < pRVar14->node_per) {
              lVar9 = 0;
              do {
                if (local_1ff8[lVar9 + 4] == node1) {
                  local_1ff8[lVar9 + 4] = node0;
                  uVar7 = (ulong)(uint)pRVar14->node_per;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < (int)uVar7);
            }
            goto LAB_0019d41d;
          }
        }
        pRVar3 = pRVar14->ref_adj->item;
        lVar13 = (long)pRVar3[(int)lVar13].next;
        if (lVar13 == -1) {
          pRVar14 = local_2018->cell[3];
          ref_grid = local_2018;
          if (-1 < node1) goto LAB_0019d272;
          goto LAB_0019d8a1;
        }
        uVar6 = ref_cell_nodes(pRVar14,pRVar3[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
        pRVar5 = local_2018;
        pRVar4 = local_2018;
      }
      uVar7 = (ulong)uVar6;
      pcVar12 = "nodes";
      uVar11 = 0x1de;
      local_2018 = pRVar4;
    }
    else {
LAB_0019d272:
      local_1ff8[3] = 0xffffffff;
      local_1ff8[2] = 0xffffffff;
      local_1ff8[1] = 0xffffffff;
      local_1ff8[0] = 0xffffffff;
      pRVar2 = pRVar14->ref_adj;
      if ((node1 < pRVar2->nnode) && (lVar13 = (long)pRVar2->first[(uint)node1], lVar13 != -1)) {
        uVar6 = ref_cell_nodes(pRVar14,pRVar2->item[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
        if (uVar6 != 0) {
LAB_0019d2af:
          uVar7 = (ulong)uVar6;
          pcVar12 = "nodes";
          uVar11 = 0x201;
          goto LAB_0019d7ad;
        }
        uVar15 = 0;
        local_2018 = ref_grid;
LAB_0019d4c8:
        ref_grid = local_2018;
        lVar9 = (long)pRVar14->node_per;
        if (0 < lVar9) {
          lVar10 = 0;
          bVar16 = false;
          do {
            if (local_1ff8[lVar10 + 4] == node0) {
              bVar16 = true;
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
          if ((bVar16) && (0 < pRVar14->node_per)) {
            lVar10 = 0;
            do {
              if ((int)uVar15 < 1) {
LAB_0019d539:
                local_1ff8[(int)uVar15] = local_1ff8[lVar10 + 4];
                uVar15 = uVar15 + 1;
              }
              else {
                uVar7 = 0;
                bVar16 = false;
                do {
                  while (bVar16) {
                    uVar7 = uVar7 + 1;
                    bVar16 = true;
                    if (uVar7 == uVar15) goto LAB_0019d547;
                  }
                  puVar1 = local_1ff8 + uVar7;
                  bVar16 = local_1ff8[lVar10 + 4] == *puVar1;
                  uVar7 = uVar7 + 1;
                } while (uVar7 != uVar15);
                if (local_1ff8[lVar10 + 4] != *puVar1) {
                  if ((int)uVar15 < 4) goto LAB_0019d539;
                  pcVar12 = "more than four remove tri nodes";
                  uVar11 = 0x20d;
                  goto LAB_0019d5da;
                }
              }
LAB_0019d547:
              lVar10 = lVar10 + 1;
            } while (lVar10 != lVar9);
          }
        }
        pRVar3 = pRVar14->ref_adj->item;
        lVar13 = (long)pRVar3[(int)lVar13].next;
        if (lVar13 != -1) {
          uVar6 = ref_cell_nodes(pRVar14,pRVar3[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
          if (uVar6 != 0) goto LAB_0019d2af;
          goto LAB_0019d4c8;
        }
        if ((4 < uVar15) || ((0x19U >> (uVar15 & 0x1f) & 1) == 0)) {
          pcVar12 = "nsafe not 3-non manifold or 4-manifold";
          uVar11 = 0x215;
LAB_0019d5da:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,uVar11,"ref_collapse_edge_manifold",pcVar12);
          return 1;
        }
        if (1 < uVar15 - 3) goto LAB_0019d742;
        uVar6 = ref_cell_node_list_around(pRVar14,node0,1000,&local_1ffc,(REF_INT *)local_fd8);
        if (uVar6 != 0) {
          uVar7 = (ulong)uVar6;
          pcVar12 = "node0 list";
          uVar11 = 0x21a;
          goto LAB_0019d7ad;
        }
        uVar6 = ref_cell_node_list_around
                          (pRVar14,node1,1000,(REF_INT *)&local_2000,(REF_INT *)local_1f78);
        if (uVar6 != 0) {
          uVar7 = (ulong)uVar6;
          pcVar12 = "node1 list";
          uVar11 = 0x21d;
          goto LAB_0019d7ad;
        }
        if (0 < (long)local_1ffc) {
          lVar13 = 0;
          do {
            if (0 < (int)local_2000) {
              uVar6 = local_fd8[lVar13];
              uVar7 = 0;
              do {
                if (uVar6 == local_1f78[uVar7]) {
                  bVar16 = true;
                  uVar8 = 0;
                  do {
                    while (bVar16) {
                      puVar1 = local_1ff8 + uVar8;
                      bVar16 = uVar6 != *puVar1;
                      uVar8 = uVar8 + 1;
                      if (uVar8 == uVar15) {
                        if (uVar6 != *puVar1) {
                          *local_2010 = 0;
                          return 0;
                        }
                        goto LAB_0019d732;
                      }
                    }
                    uVar8 = uVar8 + 1;
                    bVar16 = false;
                  } while (uVar8 != uVar15);
                }
LAB_0019d732:
                uVar7 = uVar7 + 1;
              } while (uVar7 != local_2000);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != local_1ffc);
        }
LAB_0019d742:
        if (node1 < 0) goto LAB_0019d8a1;
      }
      pRVar14 = ref_grid->cell[0];
      pRVar2 = pRVar14->ref_adj;
      if ((pRVar2->nnode <= node1) || (lVar13 = (long)pRVar2->first[(uint)node1], lVar13 == -1))
      goto LAB_0019d8a1;
      uVar6 = ref_cell_nodes(pRVar14,pRVar2->item[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
      while (uVar6 == 0) {
        uVar7 = (ulong)pRVar14->node_per;
        if ((long)uVar7 < 1) {
LAB_0019d80f:
          uVar6 = ref_cell_with(pRVar14,(REF_INT *)(local_1ff8 + 4),&local_201c);
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x23d,"ref_collapse_edge_manifold",(ulong)uVar6,"with node0 failed");
            local_2020 = uVar6;
          }
          if ((uVar6 != 5) && (uVar6 != 0)) {
            return local_2020;
          }
          if (local_201c != -1) {
LAB_0019d8c2:
            *local_2010 = 0;
            return 0;
          }
        }
        else {
          uVar8 = 0;
          bVar16 = false;
          do {
            if (local_1ff8[uVar8 + 4] == node0) {
              bVar16 = true;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          if (!bVar16) {
            if (0 < pRVar14->node_per) {
              lVar9 = 0;
              do {
                if (local_1ff8[lVar9 + 4] == node1) {
                  local_1ff8[lVar9 + 4] = node0;
                  uVar7 = (ulong)(uint)pRVar14->node_per;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < (int)uVar7);
            }
            goto LAB_0019d80f;
          }
        }
        pRVar3 = pRVar14->ref_adj->item;
        lVar13 = (long)pRVar3[(int)lVar13].next;
        if (lVar13 == -1) goto LAB_0019d8a1;
        uVar6 = ref_cell_nodes(pRVar14,pRVar3[lVar13].ref,(REF_INT *)(local_1ff8 + 4));
      }
      uVar7 = (ulong)uVar6;
      pcVar12 = "nodes";
      uVar11 = 0x232;
    }
  }
LAB_0019d7ad:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar11
         ,"ref_collapse_edge_manifold",uVar7,pcVar12);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_manifold(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, new_cell;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  { /* ensure the tri node neighbors shared by node0 and node1 are
       involved in the collapse (i.e. there are no new connections to
       created) */
    REF_INT safe_list[4], nsafe;
    REF_INT nnode0, node_list0[MAX_NODE_LIST];
    REF_INT nnode1, node_list1[MAX_NODE_LIST];
    REF_INT i, i0, i1;
    REF_BOOL already_have_it, shared;

    nsafe = 0;
    safe_list[0] = REF_EMPTY;
    safe_list[1] = REF_EMPTY;
    safe_list[2] = REF_EMPTY;
    safe_list[3] = REF_EMPTY;
    each_ref_cell_having_node(ref_cell, node1, item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

      will_be_collapsed = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
      if (will_be_collapsed) {
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          already_have_it = REF_FALSE;
          for (i = 0; i < nsafe; i++) {
            already_have_it = already_have_it || (nodes[node] == safe_list[i]);
          }
          if (!already_have_it) {
            RAS(nsafe < 4, "more than four remove tri nodes");
            safe_list[nsafe] = nodes[node];
            nsafe++;
          }
        }
      }
    }
    RAS(0 == nsafe || 3 == nsafe || 4 == nsafe,
        "nsafe not 3-non manifold or 4-manifold");

    if (3 == nsafe || 4 == nsafe) {
      RSS(ref_cell_node_list_around(ref_cell, node0, MAX_NODE_LIST, &nnode0,
                                    node_list0),
          "node0 list");
      RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode1,
                                    node_list1),
          "node1 list");
      for (i0 = 0; i0 < nnode0; i0++) {
        for (i1 = 0; i1 < nnode1; i1++) {
          if (node_list0[i0] == node_list1[i1]) {
            shared = REF_TRUE;
            for (i = 0; i < nsafe; i++) {
              shared = shared && (node_list0[i0] != safe_list[i]);
            }
            if (shared) {
              *allowed = REF_FALSE;
              return REF_SUCCESS;
            }
          }
        }
      }
    }
  }

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}